

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O2

void __thiscall
embree::avx::BVHNBuilderTwoLevel<8,_embree::Instance,_embree::InstancePrimitive>::RefBuilderLarge::
attachBuildRefs(RefBuilderLarge *this,
               BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *topBuilder)

{
  atomic<int> *paVar1;
  int iVar2;
  BVHN<4> *pBVar3;
  ulong uVar4;
  BuildRef *pBVar5;
  Vec3fx VVar6;
  Vec3fx VVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar11;
  undefined4 uVar12;
  Instance *pIVar13;
  PrimRef PVar14;
  float fVar15;
  
  pBVar3 = (topBuilder->bvh->objects).
           super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>._M_impl.
           super__Vector_impl_data._M_start[this->objectID_];
  bVar11 = BVHNBuilderTwoLevel<8,_embree::Instance,_embree::InstancePrimitive>::isGeometryModified
                     (topBuilder,this->objectID_);
  if (bVar11) {
    (*(((this->builder_).ptr)->super_RefCount)._vptr_RefCount[4])();
  }
  auVar9 = vminps_avx((undefined1  [16])(pBVar3->super_AccelData).bounds.bounds0.lower.field_0,
                      (undefined1  [16])(pBVar3->super_AccelData).bounds.bounds1.lower.field_0);
  auVar8 = vmaxps_avx((undefined1  [16])(pBVar3->super_AccelData).bounds.bounds0.upper.field_0,
                      (undefined1  [16])(pBVar3->super_AccelData).bounds.bounds1.upper.field_0);
  auVar8 = vcmpps_avx(auVar9,auVar8,2);
  uVar12 = vmovmskps_avx(auVar8);
  if ((~(byte)uVar12 & 7) == 0) {
    pIVar13 = BVHNBuilderTwoLevel<8,_embree::Instance,_embree::InstancePrimitive>::getMesh
                        (topBuilder,this->objectID_);
    auVar9 = vminps_avx((undefined1  [16])(pBVar3->super_AccelData).bounds.bounds0.lower.field_0,
                        (undefined1  [16])(pBVar3->super_AccelData).bounds.bounds1.lower.field_0);
    auVar8 = vmaxps_avx((undefined1  [16])(pBVar3->super_AccelData).bounds.bounds0.upper.field_0,
                        (undefined1  [16])(pBVar3->super_AccelData).bounds.bounds1.upper.field_0);
    VVar6.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fx_0)
         vinsertps_avx(auVar9,ZEXT416((uint)this->objectID_),0x30);
    VVar7.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fx_0)
         vinsertps_avx(auVar8,ZEXT416((pIVar13->super_Geometry).numPrimitives),0x30);
    uVar4 = (pBVar3->root).ptr;
    PVar14.upper.field_0 = VVar7.field_0;
    PVar14.lower.field_0 = VVar6.field_0;
    fVar15 = 0.0;
    if ((uVar4 & 8) == 0) {
      auVar10 = vsubps_avx((undefined1  [16])VVar7.field_0,(undefined1  [16])VVar6.field_0);
      auVar8 = vmovshdup_avx(auVar10);
      auVar9 = vshufpd_avx(auVar10,auVar10,1);
      fVar15 = auVar10._0_4_ * (auVar8._0_4_ + auVar9._0_4_) + auVar8._0_4_ * auVar9._0_4_;
      fVar15 = fVar15 + fVar15;
    }
    LOCK();
    paVar1 = &topBuilder->nextRef;
    iVar2 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    pBVar5 = (topBuilder->refs).items;
    pBVar5[iVar2].super_PrimRef = PVar14;
    pBVar5[iVar2].node.ptr = uVar4;
    pBVar5[iVar2].bounds_area = fVar15;
  }
  return;
}

Assistant:

void attachBuildRefs (BVHNBuilderTwoLevel* topBuilder)
        {
          BVH* object  = topBuilder->getBVH(objectID_); assert(object);
          
          /* build object if it got modified */
          if (topBuilder->isGeometryModified(objectID_))
            builder_->build();

          /* create build primitive */
          if (!object->getBounds().empty())
          {
#if ENABLE_DIRECT_SAH_MERGE_BUILDER
            Mesh* mesh = topBuilder->getMesh(objectID_);
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(object->getBounds(),object->root,(unsigned int)objectID_,(unsigned int)mesh->size());
#else
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(object->getBounds(),object->root);
#endif
          }
        }